

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  hmm_context_t *phVar1;
  int iVar2;
  uint uVar3;
  int local_88;
  int local_84;
  int local_78;
  int local_74;
  int local_68;
  int local_64;
  int local_5c;
  int local_50;
  int local_4c;
  int local_40;
  int local_3c;
  int local_30;
  int final_state;
  int32 bestscr;
  int32 scr;
  int32 newscr;
  int32 bestfrom;
  int32 from;
  int32 to;
  hmm_context_t *ctx;
  hmm_t *hmm_local;
  
  phVar1 = hmm->ctx;
  if (hmm->mpx == '\0') {
    local_3c = (hmm->s).ssid;
  }
  else {
    local_3c = *(hmm->s).mpx_ssid;
  }
  if (local_3c == -1) {
    local_40 = -0x38000000;
  }
  else {
    if (hmm->mpx == '\0') {
      local_4c = (hmm->s).ssid;
    }
    else {
      local_4c = *(hmm->s).mpx_ssid;
    }
    if (local_4c == -1) {
      local_50 = -1;
    }
    else {
      if (hmm->mpx == '\0') {
        local_5c = (hmm->s).ssid;
      }
      else {
        local_5c = *(hmm->s).mpx_ssid;
      }
      local_50 = (int)*hmm->ctx->sseq[local_5c];
    }
    local_40 = hmm->ctx->senscore[local_50];
  }
  *phVar1->st_sen_scr = hmm->state[0].score + local_40;
  for (newscr = 1; newscr < (int)(uint)hmm->n_emit_state; newscr = newscr + 1) {
    if (hmm->mpx == '\0') {
      local_64 = (hmm->s).ssid;
    }
    else {
      local_64 = (hmm->s).mpx_ssid[newscr];
    }
    if (local_64 == -1) {
      local_68 = -0x38000000;
    }
    else {
      if (hmm->mpx == '\0') {
        local_74 = (hmm->s).ssid;
      }
      else {
        local_74 = (hmm->s).mpx_ssid[newscr];
      }
      if (local_74 == -1) {
        local_78 = -1;
      }
      else {
        if (hmm->mpx == '\0') {
          local_84 = (hmm->s).ssid;
        }
        else {
          local_84 = (hmm->s).mpx_ssid[newscr];
        }
        local_78 = (int)hmm->ctx->sseq[local_84][newscr];
      }
      local_68 = hmm->ctx->senscore[local_78];
    }
    iVar2 = hmm->state[newscr].score + local_68;
    phVar1->st_sen_scr[newscr] = iVar2;
    if (iVar2 < -0x38000000) {
      phVar1->st_sen_scr[newscr] = -0x38000000;
    }
  }
  uVar3 = (uint)hmm->n_emit_state;
  final_state = -0x38000000;
  scr = -1;
  newscr = uVar3;
  while (newscr = newscr - 1, -1 < newscr) {
    if ((-0x38000000 < hmm->ctx->tp[hmm->tmatid][newscr][(int)uVar3]) &&
       (iVar2 = phVar1->st_sen_scr[newscr] + hmm->ctx->tp[hmm->tmatid][newscr][(int)uVar3],
       final_state < iVar2)) {
      scr = newscr;
      final_state = iVar2;
    }
  }
  (hmm->out).score = final_state;
  if (-1 < scr) {
    (hmm->out).history = hmm->state[scr].history;
  }
  local_30 = final_state;
  while (bestfrom = uVar3 - 1, -1 < bestfrom) {
    if (hmm->ctx->tp[hmm->tmatid][bestfrom][bestfrom] < -0x37ffffff) {
      local_88 = -0x38000000;
    }
    else {
      local_88 = phVar1->st_sen_scr[bestfrom] + hmm->ctx->tp[hmm->tmatid][bestfrom][bestfrom];
    }
    final_state = local_88;
    scr = -1;
    for (newscr = uVar3 - 2; -1 < newscr; newscr = newscr + -1) {
      if ((-0x38000000 < hmm->ctx->tp[hmm->tmatid][newscr][bestfrom]) &&
         (iVar2 = phVar1->st_sen_scr[newscr] + hmm->ctx->tp[hmm->tmatid][newscr][bestfrom],
         final_state < iVar2)) {
        scr = newscr;
        final_state = iVar2;
      }
    }
    if (bestfrom == 0) {
      hmm->state[0].score = final_state;
      if (-1 < scr) {
        hmm->state[0].history = hmm->state[scr].history;
      }
    }
    else {
      hmm->state[bestfrom].score = final_state;
      if (-1 < scr) {
        hmm->state[bestfrom].history = hmm->state[scr].history;
      }
    }
    if ((-1 < scr) && (hmm->mpx != '\0')) {
      (hmm->s).mpx_ssid[bestfrom] = (hmm->s).mpx_ssid[scr];
    }
    uVar3 = bestfrom;
    if (local_30 < final_state) {
      local_30 = final_state;
    }
  }
  hmm->bestscore = local_30;
  return local_30;
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) < WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) > scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) > WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) > scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->s.mpx_ssid[to] = hmm->s.mpx_ssid[bestfrom];

        if (bestscr < scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}